

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> * __thiscall
embree::XMLLoader::loadVec3fArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  byte bVar2;
  size_type sVar3;
  runtime_error *this_00;
  long *in_RDX;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *in_RDI;
  float fVar4;
  size_t i;
  XMLLoader *in_stack_000000b0;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *data;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  size_type in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe70;
  XML *in_stack_fffffffffffffe78;
  long lVar5;
  undefined7 in_stack_fffffffffffffe88;
  float local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  ulong local_130;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 uVar6;
  string local_100 [35];
  undefined1 local_dd;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  long *local_88;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float *local_18;
  reference local_10;
  
  if (*in_RDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::vector
              ((vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *)0x3b6d58);
  }
  else {
    local_88 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"ofs",&local_c9);
    XML::parm(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe28);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    if ((bVar2 & 1) == 0) {
      local_dd = 0;
      std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::vector
                ((vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *)0x3b6eb1);
      local_48 = local_88;
      lVar5 = *local_88;
      sVar3 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)(lVar5 + 0x98));
      if (sVar3 % 3 != 0) {
        uVar6 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50 = local_88;
        ParseLocation::str_abi_cxx11_((ParseLocation *)CONCAT17(uVar6,in_stack_fffffffffffffed8));
        std::operator+(in_stack_fffffffffffffe38,
                       (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        std::runtime_error::runtime_error(this_00,local_100);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_58 = local_88;
      std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98));
      std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::resize
                ((vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      for (local_130 = 0; uVar1 = local_130,
          sVar3 = std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::size
                            (in_RDI), uVar1 < sVar3; local_130 = local_130 + 1) {
        local_60 = local_88;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98),
                   local_130 * 3);
        local_140 = Token::Float((Token *)CONCAT17(bVar2,in_stack_fffffffffffffe88),
                                 SUB81((ulong)lVar5 >> 0x38,0));
        local_68 = local_88;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98),
                   local_130 * 3 + 1);
        local_144 = Token::Float((Token *)CONCAT17(bVar2,in_stack_fffffffffffffe88),
                                 SUB81((ulong)lVar5 >> 0x38,0));
        local_70 = local_88;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98),
                   local_130 * 3 + 2);
        fVar4 = Token::Float((Token *)CONCAT17(bVar2,in_stack_fffffffffffffe88),
                             SUB81((ulong)lVar5 >> 0x38,0));
        local_20 = &local_13c;
        local_28 = &local_140;
        local_30 = &local_144;
        local_38 = &local_148;
        local_13c = local_140;
        local_138 = local_144;
        local_134 = local_148;
        local_148 = fVar4;
        local_10 = std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::
                   operator[](in_RDI,local_130);
        local_18 = &local_13c;
        (local_10->field_0).field_0.x = local_13c;
        (local_10->field_0).field_0.y = local_138;
        (local_10->field_0).field_0.z = local_134;
      }
    }
    else {
      loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
                (in_stack_000000b0,(Ref<embree::XML> *)i);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Vec3f> XMLLoader::loadVec3fArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec3f>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec3f>>(xml);
    } 
    else 
    {
      std::vector<Vec3f> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3f(xml->body[3*i+0].Float(),xml->body[3*i+1].Float(),xml->body[3*i+2].Float());
      return data;
    }
  }